

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestInfo::Skip(TestInfo *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *pUVar2;
  TestPartResultReporterInterface **ppTVar3;
  TestPartResult test_part_result;
  TestPartResult TStack_88;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    pUVar2 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_info_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[8])(pTVar1,this);
    TestPartResult::TestPartResult
              (&TStack_88,kSkip,(this->location_).file._M_dataplus._M_p,(this->location_).line,"");
    ppTVar3 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                        (&pUVar2->per_thread_test_part_result_reporter_);
    (*(*ppTVar3)->_vptr_TestPartResultReporterInterface[2])(*ppTVar3,&TStack_88);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar1,this);
    pUVar2->current_test_info_ = (TestInfo *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)TStack_88.message_._M_dataplus._M_p != &TStack_88.message_.field_2) {
      operator_delete(TStack_88.message_._M_dataplus._M_p,
                      TStack_88.message_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)TStack_88.summary_._M_dataplus._M_p != &TStack_88.summary_.field_2) {
      operator_delete(TStack_88.summary_._M_dataplus._M_p,
                      TStack_88.summary_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)TStack_88.file_name_._M_dataplus._M_p != &TStack_88.file_name_.field_2) {
      operator_delete(TStack_88.file_name_._M_dataplus._M_p,
                      TStack_88.file_name_.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void TestInfo::Skip() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TestPartResult test_part_result =
      TestPartResult(TestPartResult::kSkip, this->file(), this->line(), "");
  impl->GetTestPartResultReporterForCurrentThread()->ReportTestPartResult(
      test_part_result);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);
  impl->set_current_test_info(nullptr);
}